

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void __thiscall
mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>_>::
ConditionalConstraint
          (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_> *this,
          Arguments *args)

{
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> *in_RDI;
  CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_>_>_>
  *unaff_retaddr;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_2>_> *in_stack_ffffffffffffff50;
  
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>::AlgebraicConstraint
            (in_stack_ffffffffffffff50,in_RDI);
  CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>_>_>
  ::CustomFunctionalConstraint(unaff_retaddr,in_RDI);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-2>_>::~AlgebraicConstraint
            (in_stack_ffffffffffffff50);
  return;
}

Assistant:

ConditionalConstraint(Arguments args) noexcept :
    Base(std::move(args)) { }